

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O2

optional<long> SettingToInt(SettingsValue *value)

{
  _Storage<long,_true> _Var1;
  bool bVar2;
  _Storage<long,_true> _Var3;
  string *psVar4;
  undefined8 unaff_RBX;
  ulong uVar5;
  long in_FS_OFFSET;
  string_view str;
  optional<long> oVar6;
  
  _Var1 = (_Storage<long,_true>)((_Storage<long,_true> *)(in_FS_OFFSET + 0x28))->_M_value;
  if (value->typ == VNULL) {
    uVar5 = 0;
    _Var3 = _Var1;
  }
  else {
    bVar2 = UniValue::isFalse(value);
    uVar5 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
    if (bVar2) {
      _Var3._M_value = 0;
    }
    else {
      bVar2 = UniValue::isTrue(value);
      if (bVar2) {
        _Var3._M_value = 1;
      }
      else if (value->typ == VNUM) {
        _Var3._M_value = UniValue::getInt<long>(value);
      }
      else {
        psVar4 = UniValue::get_str_abi_cxx11_(value);
        str._M_str = (psVar4->_M_dataplus)._M_p;
        str._M_len = psVar4->_M_string_length;
        _Var3._M_value = LocaleIndependentAtoi<long>(str);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == _Var1._M_value) {
    oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
         = uVar5 & 0xffffffff;
    oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = _Var3._M_value;
    return (optional<long>)
           oVar6.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

bool isNull() const { return (typ == VNULL); }